

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void lowbd_write_buffer_4xn_sse2(__m128i *in,uint8_t *output,int stride,int flipud,int height)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  int local_12c;
  undefined4 local_128;
  int local_fc;
  int local_d8;
  byte bStack_78;
  undefined1 uStack_77;
  undefined1 uStack_76;
  undefined1 uStack_75;
  __m128i u;
  __m128i v;
  int i;
  __m128i zero;
  int step;
  int j;
  int height_local;
  int flipud_local;
  int stride_local;
  uint8_t *output_local;
  __m128i *in_local;
  
  if (flipud == 0) {
    local_12c = 0;
  }
  else {
    local_12c = height + -1;
  }
  local_d8 = local_12c;
  for (local_fc = 0; local_fc < height; local_fc = local_fc + 1) {
    uVar1 = *(undefined4 *)(output + local_fc * stride);
    bStack_78 = (byte)uVar1;
    uStack_77 = (undefined1)((uint)uVar1 >> 8);
    uStack_76 = (undefined1)((uint)uVar1 >> 0x10);
    uStack_75 = (undefined1)((uint)uVar1 >> 0x18);
    auVar2 = paddsw((undefined1  [16])in[local_d8],
                    ZEXT716(CONCAT16(uStack_75,
                                     (uint6)CONCAT14(uStack_76,
                                                     (uint)CONCAT12(uStack_77,(ushort)bStack_78)))))
    ;
    v[1]._0_2_ = auVar2._0_2_;
    v[1]._2_2_ = auVar2._2_2_;
    v[1]._4_2_ = auVar2._4_2_;
    v[1]._6_2_ = auVar2._6_2_;
    local_128 = CONCAT13((0 < v[1]._6_2_) * (v[1]._6_2_ < 0x100) * auVar2[6] - (0xff < v[1]._6_2_),
                         CONCAT12((0 < v[1]._4_2_) * (v[1]._4_2_ < 0x100) * auVar2[4] -
                                  (0xff < v[1]._4_2_),
                                  CONCAT11((0 < v[1]._2_2_) * (v[1]._2_2_ < 0x100) * auVar2[2] -
                                           (0xff < v[1]._2_2_),
                                           (0 < (short)v[1]) * ((short)v[1] < 0x100) * auVar2[0] -
                                           (0xff < (short)v[1]))));
    *(undefined4 *)(output + local_fc * stride) = local_128;
    local_d8 = (-(uint)(flipud != 0) | 1) + local_d8;
  }
  return;
}

Assistant:

static inline void lowbd_write_buffer_4xn_sse2(__m128i *in, uint8_t *output,
                                               int stride, int flipud,
                                               const int height) {
  int j = flipud ? (height - 1) : 0;
  const int step = flipud ? -1 : 1;
  const __m128i zero = _mm_setzero_si128();
  for (int i = 0; i < height; ++i, j += step) {
    const __m128i v = _mm_cvtsi32_si128(*((int *)(output + i * stride)));
    __m128i u = _mm_adds_epi16(in[j], _mm_unpacklo_epi8(v, zero));
    u = _mm_packus_epi16(u, zero);
    *((int *)(output + i * stride)) = _mm_cvtsi128_si32(u);
  }
}